

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O2

void __thiscall cmCursesPathWidget::OnTab(cmCursesPathWidget *this,cmCursesMainForm *fm,WINDOW *w)

{
  FORM *form;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  string cstr;
  string glob;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = cmCursesStringWidget::GetString(&this->super_cmCursesStringWidget);
  if (pcVar2 != (char *)0x0) {
    form = (fm->super_cmCursesForm).Form;
    form_driver(form,0x204);
    form_driver(form,0x205);
    pcVar2 = cmCursesStringWidget::GetString(&this->super_cmCursesStringWidget);
    std::__cxx11::string::string((string *)&cstr,pcVar2,(allocator *)&glob);
    std::__cxx11::string::find_last_not_of((char *)&cstr,0x4762ab);
    std::__cxx11::string::substr((ulong)&glob,(ulong)&cstr);
    std::__cxx11::string::operator=((string *)&cstr,(string *)&glob);
    std::__cxx11::string::~string((string *)&glob);
    bVar1 = std::operator!=(&this->LastString,&cstr);
    if (bVar1) {
      this->Cycle = false;
      this->CurrentIndex = 0;
      std::__cxx11::string::assign((char *)&this->LastGlob);
    }
    glob._M_dataplus._M_p = (pointer)&glob.field_2;
    glob._M_string_length = 0;
    glob.field_2._M_local_buf[0] = '\0';
    if (this->Cycle == true) {
      std::__cxx11::string::_M_assign((string *)&glob);
    }
    else {
      std::operator+(&local_48,&cstr,"*");
      std::__cxx11::string::operator=((string *)&glob,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::SimpleGlob
              (&glob,&dirs,
               -(uint)((this->super_cmCursesStringWidget).super_cmCursesWidget.Type == PATH));
    if (this->CurrentIndex <
        (ulong)((long)dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)&cstr);
    }
    if (cstr._M_dataplus._M_p[cstr._M_string_length - 1] == '*') {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)&cstr);
      std::__cxx11::string::operator=((string *)&cstr,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(&cstr);
    if (bVar1) {
      std::__cxx11::string::append((char *)&cstr);
    }
    cmCursesStringWidget::SetString(&this->super_cmCursesStringWidget,&cstr);
    if (w == (WINDOW *)0x0) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar4 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar4,1);
    wrefresh(w);
    form_driver(form,0x217);
    std::__cxx11::string::_M_assign((string *)&this->LastGlob);
    std::__cxx11::string::_M_assign((string *)&this->LastString);
    this->Cycle = true;
    uVar3 = this->CurrentIndex + 1;
    uVar4 = 0;
    if (uVar3 < (ulong)((long)dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      uVar4 = uVar3;
    }
    this->CurrentIndex = uVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dirs);
    std::__cxx11::string::~string((string *)&glob);
    std::__cxx11::string::~string((string *)&cstr);
  }
  return;
}

Assistant:

void cmCursesPathWidget::OnTab(cmCursesMainForm* fm, WINDOW* w)
{
  if ( !this->GetString() )
    {
    return;
    }
  FORM* form = fm->GetForm();
  form_driver(form, REQ_NEXT_FIELD);
  form_driver(form, REQ_PREV_FIELD);
  std::string cstr = this->GetString();
  cstr = cstr.substr(0, cstr.find_last_not_of(" \t\n\r")+1);
  if ( this->LastString != cstr )
    {
    this->Cycle = false;
    this->CurrentIndex = 0;
    this->LastGlob = "";
    }
  std::string glob;
  if ( this->Cycle )
    {
    glob = this->LastGlob;
    }
  else
    {
    glob = cstr + "*";
    }
  std::vector<std::string> dirs;

  cmSystemTools::SimpleGlob(glob, dirs, (this->Type == cmState::PATH?-1:0));
  if ( this->CurrentIndex < dirs.size() )
    {
    cstr = dirs[this->CurrentIndex];
    }
  if ( cstr[cstr.size()-1] == '*' )
    {
    cstr = cstr.substr(0, cstr.size()-1);
    }

  if ( cmSystemTools::FileIsDirectory(cstr) )
    {
    cstr += "/";
    }

  this->SetString(cstr);
  touchwin(w);
  wrefresh(w);
  form_driver(form, REQ_END_FIELD);
  this->LastGlob = glob;
  this->LastString = cstr;
  this->Cycle = true;
  this->CurrentIndex ++;
  if ( this->CurrentIndex >= dirs.size() )
    {
    this->CurrentIndex = 0;
    }
}